

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3TransferBindings(sqlite3_stmt *pFromStmt,sqlite3_stmt *pToStmt)

{
  sqlite3_mutex *psVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (*(sqlite3_mutex **)(*(long *)pToStmt + 0x18) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(*(long *)pToStmt + 0x18));
  }
  lVar4 = 0;
  for (lVar3 = 0; lVar3 < *(short *)(pFromStmt + 0x88); lVar3 = lVar3 + 1) {
    sqlite3VdbeMemMove((Mem *)(*(long *)(pToStmt + 0x78) + lVar4),
                       (Mem *)(*(long *)(pFromStmt + 0x78) + lVar4));
    lVar4 = lVar4 + 0x38;
  }
  psVar1 = *(sqlite3_mutex **)(*(long *)pToStmt + 0x18);
  if (psVar1 != (sqlite3_mutex *)0x0) {
    iVar2 = (*sqlite3Config.mutex.xMutexLeave)(psVar1);
    return iVar2;
  }
  return (int)*(long *)pToStmt;
}

Assistant:

SQLITE_PRIVATE int sqlite3TransferBindings(sqlite3_stmt *pFromStmt, sqlite3_stmt *pToStmt){
  Vdbe *pFrom = (Vdbe*)pFromStmt;
  Vdbe *pTo = (Vdbe*)pToStmt;
  int i;
  assert( pTo->db==pFrom->db );
  assert( pTo->nVar==pFrom->nVar );
  sqlite3_mutex_enter(pTo->db->mutex);
  for(i=0; i<pFrom->nVar; i++){
    sqlite3VdbeMemMove(&pTo->aVar[i], &pFrom->aVar[i]);
  }
  sqlite3_mutex_leave(pTo->db->mutex);
  return SQLITE_OK;
}